

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall
mkvparser::Cues::Find(Cues *this,longlong time_ns,Track *pTrack,CuePoint **pCP,TrackPosition **pTP)

{
  TrackPosition *pTVar1;
  CuePoint **ppCVar2;
  CuePoint *pCVar3;
  longlong lVar4;
  TrackPosition *pTVar5;
  TrackPosition *pTVar6;
  CuePoint **ppCVar7;
  CuePoint **ppCVar8;
  long lVar9;
  CuePoint **ppCVar10;
  CuePoint **ppCVar11;
  
  if (((pTrack != (Track *)0x0 && -1 < time_ns) &&
      (ppCVar2 = this->m_cue_points, ppCVar2 != (CuePoint **)0x0)) &&
     (lVar9 = this->m_count, lVar9 != 0)) {
    pCVar3 = *ppCVar2;
    *pCP = pCVar3;
    if (pCVar3 != (CuePoint *)0x0) {
      lVar4 = CuePoint::GetTime(pCVar3,this->m_pSegment);
      if (lVar4 < time_ns) {
        ppCVar10 = ppCVar2 + lVar9;
        ppCVar8 = ppCVar2;
        ppCVar11 = ppCVar10;
        while (ppCVar8 < ppCVar11) {
          ppCVar7 = (CuePoint **)
                    ((((long)ppCVar11 - (long)ppCVar8 >> 3) -
                      ((long)ppCVar11 - (long)ppCVar8 >> 0x3f) & 0xfffffffffffffffeU) * 4 +
                    (long)ppCVar8);
          if (ppCVar10 <= ppCVar7) {
            return false;
          }
          if (*ppCVar7 == (CuePoint *)0x0) {
            return false;
          }
          lVar4 = CuePoint::GetTime(*ppCVar7,this->m_pSegment);
          if (lVar4 <= time_ns) {
            ppCVar8 = ppCVar7 + 1;
            ppCVar7 = ppCVar11;
          }
          ppCVar11 = ppCVar7;
          if (ppCVar7 < ppCVar8) {
            return false;
          }
        }
        if (ppCVar8 <= ppCVar2) {
          return false;
        }
        if (ppCVar8 != ppCVar11) {
          return false;
        }
        if (ppCVar10 < ppCVar8) {
          return false;
        }
        pCVar3 = ppCVar11[-1];
        *pCP = pCVar3;
        if (pCVar3 == (CuePoint *)0x0) {
          return false;
        }
        lVar4 = CuePoint::GetTime(pCVar3,this->m_pSegment);
        if (time_ns < lVar4) {
          return false;
        }
        lVar9 = (*pCP)->m_track_positions_count * 0x18;
        pTVar6 = (*pCP)->m_track_positions + -1;
        do {
          if (lVar9 == 0) goto LAB_001129d2;
          pTVar5 = pTVar6 + 1;
          lVar9 = lVar9 + -0x18;
          pTVar1 = pTVar6 + 1;
          pTVar6 = pTVar5;
        } while (pTVar1->m_track != (pTrack->m_info).number);
      }
      else {
        lVar9 = (*pCP)->m_track_positions_count * 0x18;
        pTVar6 = (*pCP)->m_track_positions + -1;
        do {
          if (lVar9 == 0) goto LAB_001129d2;
          pTVar5 = pTVar6 + 1;
          lVar9 = lVar9 + -0x18;
          pTVar1 = pTVar6 + 1;
          pTVar6 = pTVar5;
        } while (pTVar1->m_track != (pTrack->m_info).number);
      }
      goto LAB_001129d4;
    }
  }
  return false;
LAB_001129d2:
  pTVar5 = (TrackPosition *)0x0;
LAB_001129d4:
  *pTP = pTVar5;
  return pTVar5 != (TrackPosition *)0x0;
}

Assistant:

bool Cues::Find(long long time_ns, const Track* pTrack, const CuePoint*& pCP,
                const CuePoint::TrackPosition*& pTP) const {
  if (time_ns < 0 || pTrack == NULL || m_cue_points == NULL || m_count == 0)
    return false;

  CuePoint** const ii = m_cue_points;
  CuePoint** i = ii;

  CuePoint** const jj = ii + m_count;
  CuePoint** j = jj;

  pCP = *i;
  if (pCP == NULL)
    return false;

  if (time_ns <= pCP->GetTime(m_pSegment)) {
    pTP = pCP->Find(pTrack);
    return (pTP != NULL);
  }

  while (i < j) {
    // INVARIANT:
    //[ii, i) <= time_ns
    //[i, j)  ?
    //[j, jj) > time_ns

    CuePoint** const k = i + (j - i) / 2;
    if (k >= jj)
      return false;

    CuePoint* const pCP = *k;
    if (pCP == NULL)
      return false;

    const long long t = pCP->GetTime(m_pSegment);

    if (t <= time_ns)
      i = k + 1;
    else
      j = k;

    if (i > j)
      return false;
  }

  if (i != j || i > jj || i <= ii)
    return false;

  pCP = *--i;

  if (pCP == NULL || pCP->GetTime(m_pSegment) > time_ns)
    return false;

  // TODO: here and elsewhere, it's probably not correct to search
  // for the cue point with this time, and then search for a matching
  // track.  In principle, the matching track could be on some earlier
  // cue point, and with our current algorithm, we'd miss it.  To make
  // this bullet-proof, we'd need to create a secondary structure,
  // with a list of cue points that apply to a track, and then search
  // that track-based structure for a matching cue point.

  pTP = pCP->Find(pTrack);
  return (pTP != NULL);
}